

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::EndObject(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,SizeType memberCount)

{
  bool bVar1;
  size_t sVar2;
  Level *pLVar3;
  SizeType memberCount_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  sVar2 = internal::Stack<rapidjson::CrtAllocator>::GetSize(&this->level_stack_);
  if (sVar2 < 0x10) {
    __assert_fail("level_stack_.GetSize() >= sizeof(Level)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/writer.h"
                  ,0xe9,
                  "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                 );
  }
  pLVar3 = internal::Stack<rapidjson::CrtAllocator>::
           Top<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                     (&this->level_stack_);
  if (((pLVar3->inArray ^ 0xffU) & 1) == 0) {
    __assert_fail("!level_stack_.template Top<Level>()->inArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/writer.h"
                  ,0xea,
                  "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                 );
  }
  pLVar3 = internal::Stack<rapidjson::CrtAllocator>::
           Top<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                     (&this->level_stack_);
  if ((pLVar3->valueCount & 1) == 0) {
    internal::Stack<rapidjson::CrtAllocator>::
    Pop<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
              (&this->level_stack_,1);
    bVar1 = WriteEndObject(this);
    bVar1 = EndValue(this,bVar1);
    return bVar1;
  }
  __assert_fail("0 == level_stack_.template Top<Level>()->valueCount % 2",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/writer.h"
                ,0xeb,
                "bool rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::EndObject(SizeType) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
               );
}

Assistant:

bool EndObject(SizeType memberCount = 0) {
        (void)memberCount;
        RAPIDJSON_ASSERT(level_stack_.GetSize() >= sizeof(Level)); // not inside an Object
        RAPIDJSON_ASSERT(!level_stack_.template Top<Level>()->inArray); // currently inside an Array, not Object
        RAPIDJSON_ASSERT(0 == level_stack_.template Top<Level>()->valueCount % 2); // Object has a Key without a Value
        level_stack_.template Pop<Level>(1);
        return EndValue(WriteEndObject());
    }